

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall
Potassco::AspifTextOutput::output(AspifTextOutput *this,StringSpan *str,LitSpan *cond)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *psVar4;
  int *piVar5;
  AspifTextOutput *pAVar6;
  Span<int> *in_RDX;
  Span<char> *in_RSI;
  LitSpan *in_RDI;
  string *in_stack_00000018;
  undefined4 in_stack_00000020;
  Atom_t in_stack_00000024;
  AspifTextOutput *in_stack_00000028;
  size_t ep;
  string name;
  undefined8 in_stack_ffffffffffffff58;
  uint32_t uVar7;
  undefined4 in_stack_ffffffffffffff60;
  Atom_t in_stack_ffffffffffffff64;
  allocator<char> *in_stack_ffffffffffffff68;
  StringSpan *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar8;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_39;
  string local_38 [32];
  Span<int> *local_18;
  Span<char> *local_10;
  
  uVar7 = (uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = size<int>(in_RDX);
  if ((sVar3 == 1) && (bVar1 = isAtom(in_stack_ffffffffffffff70), bVar1)) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              begin<char>(local_10);
    end<char>((Span<char> *)0x110608);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::allocator<char>::~allocator(&local_39);
    iVar2 = Data::atomArity(in_stack_ffffffffffffffa8,
                            (size_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    if ((iVar2 == 0) &&
       (psVar4 = (string *)std::__cxx11::string::size(), in_stack_ffffffffffffffa8 < psVar4)) {
      std::__cxx11::string::resize((ulong)local_38);
    }
    piVar5 = begin<int>(local_18);
    in_stack_ffffffffffffff64 = atom(*piVar5);
    bVar1 = assignAtomName(in_stack_00000028,in_stack_00000024,in_stack_00000018);
    in_stack_ffffffffffffff60 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff60);
    uVar8 = (uint)bVar1;
    std::__cxx11::string::~string(local_38);
    if (uVar8 != 0) {
      return;
    }
    in_stack_ffffffffffffffa4 = 0;
  }
  pAVar6 = push((AspifTextOutput *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                uVar7);
  uVar7 = (uint32_t)((ulong)pAVar6 >> 0x20);
  Data::addOutputString
            ((Data *)CONCAT44(in_stack_00000024,in_stack_00000020),(StringSpan *)in_stack_00000018);
  push((AspifTextOutput *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),uVar7);
  push((AspifTextOutput *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  return;
}

Assistant:

void AspifTextOutput::output(const StringSpan& str, const LitSpan& cond) {
	if (size(cond) == 1 && isAtom(str)) {
		std::string name(begin(str), end(str));
		std::size_t ep;
		if (Data::atomArity(name, &ep) == 0 && ep < name.size()) {
			name.resize(ep);
		}
		if (assignAtomName(atom(*begin(cond)), name))
			return;
	}
	push(Directive_t::Output).push(data_->addOutputString(str)).push(cond);
}